

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphamapblit_nonpremul_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  DestFetchProc64 p_Var1;
  DestStoreProc64 p_Var2;
  int iVar3;
  uint c;
  QColorTrcLut *this;
  QRgba64 rgb64;
  QRgba64 *dest;
  long lVar4;
  ulong uVar5;
  int len;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QRgba64 buffer [2048];
  long local_4088;
  QRgba64 local_4040;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (clip == (QClipData *)0x0) {
    if (*(short *)((long)&color->rgba + 6) != 0) {
      if (useGammaCorrection) {
        this = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
      }
      else {
        this = (QColorTrcLut *)0x0;
      }
      c = QRgba64::toArgb32(color);
      rgb64 = (QRgba64)color->rgba;
      if ((short)(rgb64.rgba >> 0x30) == -1 && this != (QColorTrcLut *)0x0) {
        local_4040 = rgb64;
        rgb64 = QColorTrcLut::toLinear(this,rgb64);
      }
      p_Var1 = destFetchProc64[rasterBuffer->format];
      p_Var2 = destStoreProc64[rasterBuffer->format];
      lVar4 = (long)y;
      uVar8 = 0;
      local_4088 = lVar4;
      local_4040.rgba = rgb64.rgba;
      uVar11 = (ulong)(uint)mapHeight;
      if (mapHeight < 1) {
        uVar11 = uVar8;
      }
      for (; uVar8 != uVar11; uVar8 = uVar8 + 1) {
        bVar12 = true;
        iVar10 = x;
        for (uVar9 = mapWidth; 0 < (int)uVar9; uVar9 = uVar9 - len) {
          uVar6 = 0x800;
          if (uVar9 < 0x800) {
            uVar6 = (ulong)uVar9;
          }
          lVar7 = (long)iVar10;
          uVar5 = 0;
          while ((uVar5 < uVar6 && (bVar12))) {
            bVar12 = 0xfeffffff <
                     *(uint *)(rasterBuffer->m_buffer +
                              uVar5 * 4 + local_4088 * rasterBuffer->bytes_per_line + lVar7 * 4);
            uVar5 = uVar5 + 1;
          }
          len = (int)uVar6;
          if (bVar12) {
            qt_alphamapblit_argb32_oneline
                      (map + (lVar7 - x),len,&local_4040,
                       (quint32 *)
                       (rasterBuffer->m_buffer +
                       lVar7 * 4 + rasterBuffer->bytes_per_line * (lVar4 + uVar8)),c,this);
          }
          else {
            iVar3 = (int)(lVar4 + uVar8);
            dest = (*p_Var1)(local_4038,rasterBuffer,iVar10,iVar3,len);
            qt_alphamapblit_generic_oneline
                      (map + (lVar7 - x),len,rgb64,dest,(QRgba64)color->rgba,this);
            if (p_Var2 != (DestStoreProc64)0x0) {
              (*p_Var2)(rasterBuffer,iVar10,iVar3,dest,len);
            }
          }
          iVar10 = iVar10 + len;
        }
        map = map + mapStride;
        local_4088 = local_4088 + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qt_alphamapblit_generic
              (rasterBuffer,x,y,color,map,mapWidth,mapHeight,mapStride,clip,useGammaCorrection);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_alphamapblit_nonpremul_argb32(QRasterBuffer *rasterBuffer,
                                             int x, int y, const QRgba64 &color,
                                             const uchar *map,
                                             int mapWidth, int mapHeight, int mapStride,
                                             const QClipData *clip, bool useGammaCorrection)
{
    if (clip)
        return qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight,
                                       mapStride, clip, useGammaCorrection);

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    const quint32 c = color.toArgb32();
    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    for (int ly = 0; ly < mapHeight; ++ly) {
        bool dstFullyOpaque = true;
        int i = x;
        int length = mapWidth;
        while (length > 0) {
            int l = qMin(BufferSize, length);
            quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y + ly)) + i;
            for (int j = 0; j < l && dstFullyOpaque; ++j)
                dstFullyOpaque = (dest[j] & 0xff000000) == 0xff000000;
            if (dstFullyOpaque) {
                // Use RGB/ARGB32PM optimized version
                qt_alphamapblit_argb32_oneline(map + i - x, l, srcColor, dest, c, colorProfile);
            } else {
                // Use generic version
                QRgba64 *dest64 = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest64, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest64, l);
            }
            length -= l;
            i += l;
        }
        map += mapStride;
    }
}